

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VoxWriter.h
# Opt level: O2

string * ct::toStr<unsigned_int>(string *__return_storage_ptr__,uint *DOUBLE)

{
  ostringstream os;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

::std::string toStr(const T& DOUBLE) {
    ::std::ostringstream os;
    os << DOUBLE;
    return os.str();
}